

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode cr_in_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                   _Bool *peos)

{
  int *piVar1;
  byte bVar2;
  void *pvVar3;
  curl_trc_feat *pcVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  
  pvVar3 = reader->ctx;
  bVar2 = *(byte *)((long)pvVar3 + 0x44);
  *(byte *)((long)pvVar3 + 0x44) = bVar2 & 0xf7;
  if ((bVar2 & 2) != 0) {
    *pnread = 0;
    *peos = false;
    return *(CURLcode *)((long)pvVar3 + 0x40);
  }
  if ((bVar2 & 1) != 0) {
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  lVar7 = *(long *)((long)pvVar3 + 0x30);
  if (-1 < lVar7) {
    uVar6 = lVar7 - *(long *)((long)pvVar3 + 0x38);
    if (uVar6 == 0 || lVar7 < *(long *)((long)pvVar3 + 0x38)) {
      blen = 0;
    }
    else if ((long)uVar6 < (long)blen) {
      blen = uVar6;
    }
  }
  if ((blen == 0) || (*(long *)((long)pvVar3 + 0x20) == 0)) {
LAB_0014a6a5:
    if ((-1 < lVar7) && (*(long *)((long)pvVar3 + 0x38) < lVar7)) {
      Curl_failf(data,"client read function EOF fail, only %ld/%ld of needed bytes read");
      return CURLE_READ_ERROR;
    }
    *pnread = 0;
    *peos = true;
    *(byte *)((long)pvVar3 + 0x44) = *(byte *)((long)pvVar3 + 0x44) | 1;
  }
  else {
    Curl_set_in_callback(data,true);
    uVar6 = (**(code **)((long)pvVar3 + 0x20))(buf,1,blen,*(undefined8 *)((long)pvVar3 + 0x28));
    Curl_set_in_callback(data,false);
    bVar2 = *(byte *)((long)pvVar3 + 0x44);
    bVar5 = bVar2 | 4;
    *(byte *)((long)pvVar3 + 0x44) = bVar5;
    if (uVar6 == 0x10000001) {
      if ((data->conn->handler->flags & 0x10) != 0) {
        Curl_failf(data,"Read callback asked for PAUSE when not supported");
        return CURLE_READ_ERROR;
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
          && (0 < Curl_trc_feat_read.log_level)))) {
        Curl_trc_read(data,"cr_in_read, callback returned CURL_READFUNC_PAUSE");
        bVar5 = *(byte *)((long)pvVar3 + 0x44);
      }
      *(byte *)((long)pvVar3 + 0x44) = bVar5 | 8;
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 0x20;
      *pnread = 0;
      *peos = false;
      goto LAB_0014a6dc;
    }
    if (uVar6 == 0x10000000) {
      Curl_failf(data,"operation aborted by callback");
      *pnread = 0;
      *peos = false;
      *(byte *)((long)pvVar3 + 0x44) = *(byte *)((long)pvVar3 + 0x44) | 2;
      *(undefined4 *)((long)pvVar3 + 0x40) = 0x2a;
      return CURLE_ABORTED_BY_CALLBACK;
    }
    if (uVar6 == 0) {
      lVar7 = *(long *)((long)pvVar3 + 0x30);
      goto LAB_0014a6a5;
    }
    if (blen < uVar6) {
      Curl_failf(data,"read function returned funny value");
      *pnread = 0;
      *peos = false;
      *(byte *)((long)pvVar3 + 0x44) = *(byte *)((long)pvVar3 + 0x44) | 2;
      *(undefined4 *)((long)pvVar3 + 0x40) = 0x1a;
      return CURLE_READ_ERROR;
    }
    lVar7 = *(long *)((long)pvVar3 + 0x38) + uVar6;
    *(long *)((long)pvVar3 + 0x38) = lVar7;
    if (-1 < *(long *)((long)pvVar3 + 0x30)) {
      *(byte *)((long)pvVar3 + 0x44) = bVar2 & 0xfe | 4 | *(long *)((long)pvVar3 + 0x30) <= lVar7;
    }
    *pnread = uVar6;
    *peos = (_Bool)(*(byte *)((long)pvVar3 + 0x44) & 1);
  }
  if (data == (Curl_easy *)0x0) {
    return CURLE_OK;
  }
LAB_0014a6dc:
  if (((((data->set).field_0x8cd & 0x10) != 0) &&
      ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"cr_in_read(len=%zu, total=%ld, read=%ld) -> %d, nread=%zu, eos=%d",blen,
                  *(undefined8 *)((long)pvVar3 + 0x30),*(undefined8 *)((long)pvVar3 + 0x38),0,
                  *pnread,(ulong)*peos);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_in_read(struct Curl_easy *data,
                           struct Curl_creader *reader,
                           char *buf, size_t blen,
                           size_t *pnread, bool *peos)
{
  struct cr_in_ctx *ctx = reader->ctx;
  size_t nread;

  ctx->is_paused = FALSE;

  /* Once we have errored, we will return the same error forever */
  if(ctx->errored) {
    *pnread = 0;
    *peos = FALSE;
    return ctx->error_result;
  }
  if(ctx->seen_eos) {
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }
  /* respect length limitations */
  if(ctx->total_len >= 0) {
    curl_off_t remain = ctx->total_len - ctx->read_len;
    if(remain <= 0)
      blen = 0;
    else if(remain < (curl_off_t)blen)
      blen = (size_t)remain;
  }
  nread = 0;
  if(ctx->read_cb && blen) {
    Curl_set_in_callback(data, TRUE);
    nread = ctx->read_cb(buf, 1, blen, ctx->cb_user_data);
    Curl_set_in_callback(data, FALSE);
    ctx->has_used_cb = TRUE;
  }

  switch(nread) {
  case 0:
    if((ctx->total_len >= 0) && (ctx->read_len < ctx->total_len)) {
      failf(data, "client read function EOF fail, "
            "only %"FMT_OFF_T"/%"FMT_OFF_T " of needed bytes read",
            ctx->read_len, ctx->total_len);
      return CURLE_READ_ERROR;
    }
    *pnread = 0;
    *peos = TRUE;
    ctx->seen_eos = TRUE;
    break;

  case CURL_READFUNC_ABORT:
    failf(data, "operation aborted by callback");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_ABORTED_BY_CALLBACK;
    return CURLE_ABORTED_BY_CALLBACK;

  case CURL_READFUNC_PAUSE:
    if(data->conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it cannot pause since the transfer
         is not done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported");
      return CURLE_READ_ERROR;
    }
    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    CURL_TRC_READ(data, "cr_in_read, callback returned CURL_READFUNC_PAUSE");
    ctx->is_paused = TRUE;
    data->req.keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    *pnread = 0;
    *peos = FALSE;
    break; /* nothing was read */

  default:
    if(nread > blen) {
      /* the read function returned a too large value */
      failf(data, "read function returned funny value");
      *pnread = 0;
      *peos = FALSE;
      ctx->errored = TRUE;
      ctx->error_result = CURLE_READ_ERROR;
      return CURLE_READ_ERROR;
    }
    ctx->read_len += nread;
    if(ctx->total_len >= 0)
      ctx->seen_eos = (ctx->read_len >= ctx->total_len);
    *pnread = nread;
    *peos = ctx->seen_eos;
    break;
  }
  CURL_TRC_READ(data, "cr_in_read(len=%zu, total=%"FMT_OFF_T
                ", read=%"FMT_OFF_T") -> %d, nread=%zu, eos=%d",
                blen, ctx->total_len, ctx->read_len, CURLE_OK,
                *pnread, *peos);
  return CURLE_OK;
}